

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O1

void __thiscall
CTestGen9Resource_Test1DTileYfResourceArrays_Test::TestBody
          (CTestGen9Resource_Test1DTileYfResourceArrays_Test *this)

{
  CTestGen9Resource_Test1DTileYfResourceArrays_Test *this_00;
  undefined4 uVar1;
  GMM_RESOURCE_INFO *ResourceInfo;
  uint uVar2;
  int iVar3;
  uint32_t i;
  ulong uVar4;
  long lVar5;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  int iStack_84;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  long local_40;
  CTestGen9Resource_Test1DTileYfResourceArrays_Test *local_38;
  
  local_68 = 0;
  uStack_b0 = 0;
  uStack_80 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78 = 0;
  uStack_70 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_c8 = 1;
  uStack_60 = 0x100000000;
  uStack_c0 = 0x400000000;
  local_b8 = 0x2000000000;
  local_88 = 0;
  iStack_84 = 4;
  lVar5 = 0;
  uVar4 = 0;
  local_38 = this;
  do {
    uVar1 = 0;
    if (uVar4 < 5) {
      uVar1 = *(undefined4 *)((long)&DAT_001ad00c + lVar5);
    }
    local_c8 = CONCAT44(uVar1,(undefined4)local_c8);
    local_98 = 0x4000;
    uStack_90 = CONCAT44(uStack_90._4_4_,1);
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,&local_c8);
    this_00 = local_38;
    iVar3 = 0;
    if (uVar4 < 5) {
      iVar3 = *(int *)((long)&DAT_001ad020 + lVar5);
    }
    uVar2 = *(uint32_t *)((long)&DAT_001ac330 + lVar5) - 1;
    uVar2 = ~uVar2 & (int)local_98 + uVar2;
    iVar3 = iVar3 * uVar2 * iStack_84;
    local_40 = lVar5;
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)local_38,ResourceInfo,*(uint32_t *)((long)&DAT_001ac330 + lVar5));
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this_00,ResourceInfo,(ulong)(iVar3 + 0xfffU & 0xfffff000));
    lVar5 = local_40;
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this_00,ResourceInfo,(ulong)uVar2);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 4;
  } while (uVar4 != 5);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test1DTileYfResourceArrays)
{
    const uint32_t TileSize[TEST_BPP_MAX] = {4096, 2048, 1024, 512, 256};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledYf   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.ArraySize            = 4;

    // Allocate more than 1 page
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 16 * 1024; // 16K is the max width you can specify
        gmmParams.BaseHeight  = 1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, TileSize[i]);
        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes * gmmParams.ArraySize, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, TileSize[i]);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<true>(ResourceInfo, AlignedWidth);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}